

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

void TestWaveform(AmpIO *board)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  byte bVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  double extraout_XMM0_Qa;
  quadlet_t waveform_read [256];
  quadlet_t waveform [256];
  quadlet_t local_828 [514];
  
  (*(board->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Setting waveform with ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," counts (1 msec edges)",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar11 = (uint)(long)(0.001 / extraout_XMM0_Qa);
  if (0x7fffff < uVar11) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: numTicks does not fit in 23 bits",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  bVar12 = 0;
  memset(local_828,0,0x3fc);
  bVar4 = 0;
  bVar5 = 0;
  bVar7 = 0;
  uVar9 = 0;
  do {
    uVar10 = (uint)uVar9 & 3;
    if ((uVar9 & 3) == 0) {
      bVar7 = 1 - bVar7;
    }
    if (uVar10 == 1) {
      bVar5 = 1 - bVar5;
    }
    if (uVar10 == 2) {
      bVar4 = 1 - bVar4;
    }
    if (uVar10 == 3) {
      bVar12 = 1 - bVar12;
    }
    local_828[uVar9 + 0x100] =
         (uint)bVar7 | uVar11 << 8 | (uint)bVar5 * 2 | (uint)bVar4 << 2 | (uint)bVar12 << 3 |
         0x80000000;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0xff);
  local_828[0x1ff] = 0;
  local_828[0xff] = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Writing test pattern",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  bVar1 = AmpIO::WriteWaveformTable(board,local_828 + 0x100,0,0x100);
  if (bVar1) {
    Amp1394_Sleep(0.05);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading data",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    bVar1 = AmpIO::ReadWaveformTable(board,local_828,0,0x100);
    if (bVar1) {
      lVar6 = 0;
      do {
        if (local_828[lVar6] != local_828[lVar6 + 0x100]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Mismatch at quadlet ",0x14);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", read ",7);
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", expected ",0xb);
          plVar3 = (long *)std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          lVar6 = *plVar3;
          *(uint *)((long)plVar3 + *(long *)(lVar6 + -0x18) + 0x18) =
               *(uint *)((long)plVar3 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
          goto LAB_00109e4d;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      pcVar8 = "Pattern verified!";
      lVar6 = 0x11;
    }
    else {
      pcVar8 = "ReadWaveformTable failed";
      lVar6 = 0x18;
    }
  }
  else {
    pcVar8 = "WriteWaveformTable failed";
    lVar6 = 0x19;
  }
  plVar3 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar6);
  lVar6 = std::cout;
LAB_00109e4d:
  std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TestWaveform(AmpIO *board)
{
    const unsigned int WLEN = 256;
    quadlet_t waveform[WLEN];
    quadlet_t waveform_read[WLEN];
    size_t i;
    // Set up square waves that change every 1 msec
    double clkPer = board->GetFPGAClockPeriod();
    uint32_t numTicks = static_cast<uint32_t>(0.001/clkPer);
    std::cout << "Setting waveform with " << numTicks << " counts (1 msec edges)" << std::endl;
    if ((numTicks&0x7fffff) != numTicks)
        std::cout << "Warning: numTicks does not fit in 23 bits" << std::endl;
    unsigned char dout1 = 0;
    unsigned char dout2 = 0;
    unsigned char dout3 = 0;
    unsigned char dout4 = 0;
    for (i = 0; i < WLEN-1; i++) {
        if (i%4 == 0) dout1 = 1-dout1;
        if (i%4 == 1) dout2 = 1-dout2;
        if (i%4 == 2) dout3 = 1-dout3;
        if (i%4 == 3) dout4 = 1-dout4;
        waveform[i] = 0x80000000 | (numTicks << 8) | (dout4 << 3) | (dout3 << 2) | (dout2 << 1) | dout1;
        waveform_read[i] = 0;
    }
    waveform[WLEN-1] = 0;
    waveform_read[WLEN-1] = 0;
    std::cout << "Writing test pattern" << std::endl;
    if (!board->WriteWaveformTable(waveform, 0, WLEN)) {
        std::cout << "WriteWaveformTable failed" << std::endl;
        return;
    }
    Amp1394_Sleep(0.05);
    std::cout << "Reading data" << std::endl;
    if (!board->ReadWaveformTable(waveform_read, 0, WLEN)) {
        std::cout << "ReadWaveformTable failed" << std::endl;
        return;
    }
    for (i = 0; i < WLEN; i++) {
        if (waveform_read[i] != waveform[i]) {
            std::cout << "Mismatch at quadlet " << i << ", read " << std::hex
                      << waveform_read[i] << ", expected " << waveform[i]
                      << std::dec << std::endl;
            return;
        }
    }
    std::cout << "Pattern verified!" << std::endl;
#if 0
    // Following code will actually generate waveform on DOUT lines
    board->WriteDigitalOutput(0x0f,0x00);
    // Start waveform on all DOUT channels
    board->WriteWaveformControl(0x0f, 0x0f);
#endif
}